

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeForJS.cpp
# Opt level: O0

void __thiscall
wasm::OptimizeForJSPass::rewritePopcntEqualOne(OptimizeForJSPass *this,Expression *expr)

{
  Type input;
  UnaryOp op;
  BinaryOp op_00;
  BinaryOp op_01;
  BasicType id;
  Function *func;
  Module *pMVar1;
  Unary *pUVar2;
  LocalGet *left;
  LocalGet *left_00;
  Const *right;
  Binary *pBVar3;
  Unary *right_00;
  PostWalker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_> *this_00;
  Type local_88;
  Literal local_80;
  uintptr_t local_68;
  uintptr_t local_60;
  uintptr_t local_58;
  uintptr_t local_50;
  Builder local_48;
  Builder builder;
  Localizer temp;
  Type TStack_20;
  UnaryOp eqzOp;
  Type type;
  Expression *expr_local;
  OptimizeForJSPass *this_local;
  
  TStack_20.id = (expr->type).id;
  type.id = (uintptr_t)expr;
  op = Abstract::getUnary(TStack_20,EqZ);
  input.id = type.id;
  this_00 = &(this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>
  ;
  func = Walker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>::getFunction
                   (&this_00->
                     super_Walker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>
                   );
  pMVar1 = Walker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>::getModule
                     (&this_00->
                       super_Walker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>
                     );
  Localizer::Localizer((Localizer *)&builder,(Expression *)input.id,func,pMVar1);
  pMVar1 = Walker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>::getModule
                     (&this_00->
                       super_Walker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>
                     );
  Builder::Builder(&local_48,pMVar1);
  pUVar2 = Builder::makeUnary(&local_48,op,(Expression *)temp._0_8_);
  pUVar2 = Builder::makeUnary(&local_48,EqZInt32,(Expression *)pUVar2);
  local_50 = TStack_20.id;
  op_00 = Abstract::getBinary(TStack_20,And);
  local_58 = TStack_20.id;
  left = Builder::makeLocalGet(&local_48,(Index)builder.wasm,TStack_20);
  local_60 = TStack_20.id;
  op_01 = Abstract::getBinary(TStack_20,Sub);
  local_68 = TStack_20.id;
  left_00 = Builder::makeLocalGet(&local_48,(Index)builder.wasm,TStack_20);
  id = wasm::Type::getBasic(&stack0xffffffffffffffe0);
  wasm::Type::Type(&local_88,id);
  wasm::Literal::makeOne(&local_80,local_88);
  right = Builder::makeConst(&local_48,&local_80);
  pBVar3 = Builder::makeBinary(&local_48,op_01,(Expression *)left_00,(Expression *)right);
  pBVar3 = Builder::makeBinary(&local_48,op_00,(Expression *)left,(Expression *)pBVar3);
  right_00 = Builder::makeUnary(&local_48,op,(Expression *)pBVar3);
  pBVar3 = Builder::makeBinary(&local_48,AndInt32,(Expression *)pUVar2,(Expression *)right_00);
  Walker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>::replaceCurrent
            (&this_00->
              super_Walker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>,
             (Expression *)pBVar3);
  wasm::Literal::~Literal(&local_80);
  return;
}

Assistant:

void rewritePopcntEqualOne(Expression* expr) {
    // popcnt(x) == 1   ==>   !!x & !(x & (x - 1))
    using namespace Abstract;

    Type type = expr->type;

    UnaryOp eqzOp = getUnary(type, EqZ);
    Localizer temp(expr, getFunction(), getModule());
    Builder builder(*getModule());

    replaceCurrent(builder.makeBinary(
      AndInt32,
      builder.makeUnary(EqZInt32, builder.makeUnary(eqzOp, temp.expr)),
      builder.makeUnary(
        eqzOp,
        builder.makeBinary(
          getBinary(type, And),
          builder.makeLocalGet(temp.index, type),
          builder.makeBinary(
            getBinary(type, Sub),
            builder.makeLocalGet(temp.index, type),
            builder.makeConst(Literal::makeOne(type.getBasic())))))));
  }